

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void printcrbitm(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  sbyte sVar2;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar1 = MCOperand_getReg(op);
  fmt = "0x%x";
  switch(uVar1) {
  case 0xc:
    sVar2 = 1;
    goto LAB_001a3e17;
  case 0xd:
    sVar2 = 2;
    goto LAB_001a3e17;
  case 0xe:
    sVar2 = 3;
    goto LAB_001a3e17;
  case 0xf:
    sVar2 = 4;
    break;
  case 0x10:
    sVar2 = 5;
    break;
  case 0x11:
    sVar2 = 6;
    break;
  case 0x12:
    sVar2 = 7;
    break;
  default:
    sVar2 = 0;
    goto LAB_001a3e17;
  }
  fmt = "%u";
LAB_001a3e17:
  SStream_concat(O,fmt,(ulong)(0x80 >> sVar2));
  return;
}

Assistant:

static void printcrbitm(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned RegNo, tmp;
	unsigned CCReg = MCOperand_getReg(MCInst_getOperand(MI, OpNo));

	switch (CCReg) {
		default: // llvm_unreachable("Unknown CR register");
		case PPC_CR0: RegNo = 0; break;
		case PPC_CR1: RegNo = 1; break;
		case PPC_CR2: RegNo = 2; break;
		case PPC_CR3: RegNo = 3; break;
		case PPC_CR4: RegNo = 4; break;
		case PPC_CR5: RegNo = 5; break;
		case PPC_CR6: RegNo = 6; break;
		case PPC_CR7: RegNo = 7; break;
	}

	tmp = 0x80 >> RegNo;
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", tmp);
	else
		SStream_concat(O, "%u", tmp);
}